

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O2

void __thiscall
OpenMD::SimpleTypeData<OpenMD::ZhouParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::ZhouParameters> *this)

{
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__SimpleTypeData_00225078;
  ZhouParameters::~ZhouParameters(&this->data_);
  GenericData::~GenericData(&this->super_GenericData);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}